

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressStream
                 (ZSTD_CStream *zcs,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  size_t sVar1;
  
  sVar1 = ZSTD_compressStream2(zcs,output,input,ZSTD_e_continue);
  if (sVar1 < 0xffffffffffffff89) {
    sVar1 = ZSTD_nextInputSizeHint(zcs);
    return sVar1;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_compressStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    FORWARD_IF_ERROR( ZSTD_compressStream2(zcs, output, input, ZSTD_e_continue) , "");
    return ZSTD_nextInputSizeHint_MTorST(zcs);
}